

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

char * __thiscall QListModel::index(QListModel *this,char *__s,int __c)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  ulong uVar3;
  qsizetype qVar4;
  undefined4 in_register_00000014;
  QListWidgetItem *pQVar5;
  long in_FS_OFFSET;
  QListWidgetItem *item;
  long local_20;
  
  pQVar5 = (QListWidgetItem *)CONCAT44(in_register_00000014,__c);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  item = pQVar5;
  if ((((pQVar5 == (QListWidgetItem *)0x0) ||
       ((QAbstractItemView *)pQVar5->view == (QAbstractItemView *)0x0)) ||
      (pQVar2 = QAbstractItemView::model((QAbstractItemView *)pQVar5->view),
      pQVar2 != (QAbstractItemModel *)__s)) || (*(ulong *)(__s + 0x20) == 0)) {
    *(undefined8 *)this = 0xffffffffffffffff;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      *(undefined8 *)&this->field_0x8 = 0;
      (this->items).d.d = (Data *)0x0;
      return (char *)this;
    }
    goto LAB_0051fa51;
  }
  iVar1 = pQVar5->d->theid;
  uVar3 = (ulong)iVar1;
  if ((((long)uVar3 < 0) || (*(ulong *)(__s + 0x20) <= uVar3)) ||
     (*(QListWidgetItem **)(*(long *)(__s + 0x18) + uVar3 * 8) != pQVar5)) {
    qVar4 = QtPrivate::lastIndexOf<QListWidgetItem*,QListWidgetItem*>
                      ((QList<QListWidgetItem_*> *)(__s + 0x10),&item,-1);
    iVar1 = (int)qVar4;
    if (iVar1 != -1) {
      item->d->theid = iVar1;
      pQVar5 = item;
      goto LAB_0051fa26;
    }
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    (this->items).d.d = (Data *)0x0;
  }
  else {
LAB_0051fa26:
    *(int *)this = iVar1;
    *(undefined4 *)&this->field_0x4 = 0;
    *(QListWidgetItem **)&this->field_0x8 = pQVar5;
    (this->items).d.d = (Data *)__s;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (char *)this;
  }
LAB_0051fa51:
  __stack_chk_fail();
}

Assistant:

QModelIndex QListModel::index(const QListWidgetItem *item_) const
{
    QListWidgetItem *item = const_cast<QListWidgetItem *>(item_);
    if (!item || !item->view || static_cast<const QListModel *>(item->view->model()) != this
        || items.isEmpty())
        return QModelIndex();
    int row;
    const int theid = item->d->theid;
    if (theid >= 0 && theid < items.size() && items.at(theid) == item) {
        row = theid;
    } else { // we need to search for the item
        row = items.lastIndexOf(item);  // lastIndexOf is an optimization in favor of indexOf
        if (row == -1) // not found
            return QModelIndex();
        item->d->theid = row;
    }
    return createIndex(row, 0, item);
}